

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

phnhashelement_t * phninstall(char *name,phnhashelement_t **hashtable)

{
  uint uVar1;
  phnhashelement_t *ppVar2;
  char *pcVar3;
  
  ppVar2 = phnlookup(name,hashtable);
  if (ppVar2 == (phnhashelement_t *)0x0) {
    ppVar2 = (phnhashelement_t *)calloc(1,0x18);
    if (ppVar2 != (phnhashelement_t *)0x0) {
      pcVar3 = strdup(name);
      ppVar2->phone = pcVar3;
      if (pcVar3 != (char *)0x0) {
        uVar1 = phnhash(name);
        ppVar2->next = hashtable[uVar1];
        hashtable[uVar1] = ppVar2;
        return ppVar2;
      }
    }
    ppVar2 = (phnhashelement_t *)0x0;
  }
  return ppVar2;
}

Assistant:

phnhashelement_t *phninstall(char *name, phnhashelement_t **hashtable)
{
    phnhashelement_t  *np;
    unsigned hashval;

    if ((np = phnlookup(name, hashtable)) == NULL)
    {
        np = (phnhashelement_t *) calloc (1,sizeof(*np));
        if (np == NULL || (np->phone = strdup(name)) == NULL)
            return NULL;

        hashval = phnhash(name);
        np->next = hashtable[hashval];
        hashtable[hashval] = np;
    }
    return np;
}